

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_container.cc
# Opt level: O2

int main(void)

{
  pointer plVar1;
  result_type_conflict rVar2;
  long *val;
  pointer plVar3;
  allocator_type local_a1;
  vector<long,_std::allocator<long>_> w;
  uniform_int_dist U;
  vector<long,_std::allocator<long>_> v;
  yarn2 R;
  _Bind<trng::uniform_int_dist_(std::reference_wrapper<trng::yarn2>)> local_50;
  _Bind<trng::uniform_int_dist_(std::reference_wrapper<trng::yarn2>)> local_38;
  
  trng::yarn2::yarn2(&R,trng::yarn2::LEcuyer1);
  U.P.a_ = 0;
  U.P.b_ = 100;
  U.P.d_ = 100;
  std::vector<long,_std::allocator<long>_>::vector(&v,10,(allocator_type *)&w);
  std::operator<<((ostream *)&std::cout,"random number generation by call operator\n");
  plVar1 = v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (plVar3 = v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start; plVar3 != plVar1; plVar3 = plVar3 + 1) {
    rVar2 = trng::uniform_int_dist::operator()(&U,&R);
    *plVar3 = (long)rVar2;
  }
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                      v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<long,_std::allocator<long>_>::vector(&w,0xc,&local_a1);
  std::operator<<((ostream *)&std::cout,"random number generation by std::generate\n");
  local_38._M_f.P.a_ = U.P.a_;
  local_38._M_f.P.b_ = U.P.b_;
  local_38._M_f.P.d_ = U.P.d_;
  local_38._M_bound_args.super__Tuple_impl<0UL,_std::reference_wrapper<trng::yarn2>_>.
  super__Head_base<0UL,_std::reference_wrapper<trng::yarn2>,_false>._M_head_impl._M_data =
       (_Tuple_impl<0UL,_std::reference_wrapper<trng::yarn2>_>)
       (_Tuple_impl<0UL,_std::reference_wrapper<trng::yarn2>_>)&R;
  std::
  generate<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::_Bind<trng::uniform_int_dist(std::reference_wrapper<trng::yarn2>)>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             w.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                      w.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish,&local_38);
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             w.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                      w.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::operator<<((ostream *)&std::cout,"random number generation by std::generate\n");
  local_50._M_f.P.a_ = U.P.a_;
  local_50._M_f.P.b_ = U.P.b_;
  local_50._M_f.P.d_ = U.P.d_;
  local_50._M_bound_args.super__Tuple_impl<0UL,_std::reference_wrapper<trng::yarn2>_>.
  super__Head_base<0UL,_std::reference_wrapper<trng::yarn2>,_false>._M_head_impl._M_data =
       (_Tuple_impl<0UL,_std::reference_wrapper<trng::yarn2>_>)
       (_Tuple_impl<0UL,_std::reference_wrapper<trng::yarn2>_>)&R;
  std::
  generate<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::_Bind<trng::uniform_int_dist(std::reference_wrapper<trng::yarn2>)>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             w.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                      w.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish,&local_50);
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             w.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                      w.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::operator<<((ostream *)&std::cout,"same sequence as above, but in a random shuffled order\n");
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,trng::yarn2&>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             w.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                      w.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish,&R);
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             w.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                      w.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&w.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&v.super__Vector_base<long,_std::allocator<long>_>);
  return 0;
}

Assistant:

int main() {
  trng::yarn2 R;
  trng::uniform_int_dist U(0, 100);
  std::vector<long> v(10);

  std::cout << "random number generation by call operator\n";
  for (auto &val : v)
    val = U(R);
  print_range(v.begin(), v.end());
  std::vector<long> w(12);
  std::cout << "random number generation by std::generate\n";
  std::generate(w.begin(), w.end(), std::bind(U, std::ref(R)));
  print_range(w.begin(), w.end());
  std::cout << "random number generation by std::generate\n";
  std::generate(w.begin(), w.end(), std::bind(U, std::ref(R)));
  print_range(w.begin(), w.end());
  std::cout << "same sequence as above, but in a random shuffled order\n";
  std::shuffle(w.begin(), w.end(), R);
  print_range(w.begin(), w.end());
  return EXIT_SUCCESS;
}